

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
               (AllocatorType *allocator,SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *obj,
               size_t plusSize,bool prefix)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,prefix) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x13c,"(prefix)","prefix");
    if (!bVar2) goto LAB_006ae59b;
    *puVar3 = 0;
  }
  SmallHeapBlockT<SmallAllocationBlockAttributes>::~SmallHeapBlockT
            (&obj->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
  if (0xfffffffffffffeef < plusSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x141,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) goto LAB_006ae59b;
    *puVar3 = 0;
  }
  if ((plusSize + 7 & 0xfffffffffffffff8) != plusSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x144,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar2) {
LAB_006ae59b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapAllocator::Free(allocator,(void *)((long)obj - plusSize),plusSize + 0x110);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize, bool prefix)
{
    Assert(prefix);
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    // NOTE: This may cause the object not be double aligned
    Assert(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(((char *)obj) - plusSize,
        _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}